

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O0

EnumVal * __thiscall
flatbuffers::EnumDef::ReverseLookup(EnumDef *this,int64_t enum_idx,bool skip_union_default)

{
  bool bVar1;
  vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_> *pvVar2;
  reference ppEVar3;
  int64_t iVar4;
  byte local_41;
  __normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
  local_40;
  __normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
  local_38;
  __normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
  local_30;
  __normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
  it;
  int skip_first;
  bool skip_union_default_local;
  int64_t enum_idx_local;
  EnumDef *this_local;
  
  local_41 = 0;
  if ((this->is_union & 1U) != 0) {
    local_41 = skip_union_default;
  }
  it._M_current._0_4_ = (uint)(local_41 & 1);
  it._M_current._7_1_ = skip_union_default;
  pvVar2 = Vals(this);
  local_38._M_current =
       (EnumVal **)
       std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>::begin(pvVar2);
  local_30 = __gnu_cxx::
             __normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
             ::operator+(&local_38,(long)(int)(uint)it._M_current);
  while( true ) {
    pvVar2 = Vals(this);
    local_40._M_current =
         (EnumVal **)
         std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>::end(pvVar2);
    bVar1 = __gnu_cxx::operator!=(&local_30,&local_40);
    if (!bVar1) {
      return (EnumVal *)0x0;
    }
    ppEVar3 = __gnu_cxx::
              __normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
              ::operator*(&local_30);
    iVar4 = EnumVal::GetAsInt64(*ppEVar3);
    if (iVar4 == enum_idx) break;
    __gnu_cxx::
    __normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
    ::operator++(&local_30);
  }
  ppEVar3 = __gnu_cxx::
            __normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
            ::operator*(&local_30);
  return *ppEVar3;
}

Assistant:

EnumVal *EnumDef::ReverseLookup(int64_t enum_idx,
                                bool skip_union_default) const {
  auto skip_first = static_cast<int>(is_union && skip_union_default);
  for (auto it = Vals().begin() + skip_first; it != Vals().end(); ++it) {
    if ((*it)->GetAsInt64() == enum_idx) { return *it; }
  }
  return nullptr;
}